

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.cpp
# Opt level: O0

string * __thiscall
mjs::unicode::utf16_to_utf8_abi_cxx11_(string *__return_storage_ptr__,unicode *this,wstring_view in)

{
  size_type sVar1;
  wchar_t *src;
  conversion_error *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  const_iterator local_50;
  uint local_48;
  uint out_len;
  conversion_result local_38;
  conversion_result conv;
  uint i;
  char buffer [4];
  uint l;
  wstring_view in_local;
  string *res;
  
  in_local._M_len = in._M_len;
  _l = this;
  in_local._M_str = (wchar_t *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l);
  conv.length = 0;
  while( true ) {
    if ((uint)sVar1 <= conv.length) {
      return __return_storage_ptr__;
    }
    src = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&l,(ulong)conv.length
                    );
    local_38 = utf16_to_utf32<wchar_t>(src,(uint)sVar1 - conv.length);
    if (local_38.length == 0) break;
    local_48 = utf32_to_utf8<char>(local_38.code_point,(char *)&conv.code_point);
    if (local_48 == 0) {
      pcVar2 = (conversion_error *)__cxa_allocate_exception(8);
      conversion_error::conversion_error(pcVar2);
      __cxa_throw(pcVar2,&conversion_error::typeinfo,conversion_error::~conversion_error);
    }
    local_58._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
    std::__cxx11::string::insert<char*,void>
              ((string *)__return_storage_ptr__,local_50,(char *)&conv.code_point,
               (char *)((long)&conv.code_point + (ulong)local_48));
    conv.length = local_38.length + conv.length;
  }
  pcVar2 = (conversion_error *)__cxa_allocate_exception(8);
  conversion_error::conversion_error(pcVar2);
  __cxa_throw(pcVar2,&conversion_error::typeinfo,conversion_error::~conversion_error);
}

Assistant:

std::string utf16_to_utf8(const std::wstring_view in) {
    std::string res;
    const auto l = static_cast<unsigned>(in.length());
    char buffer[utf8_max_length];
    for (unsigned i = 0; i < l;) {
        const auto conv = utf16_to_utf32(&in[i], l - i);
        if (conv.length == invalid_length) {
            throw conversion_error{};
        }
        const auto out_len = utf32_to_utf8(conv.code_point, buffer);
        if (!out_len) {
            throw conversion_error{};
        }
        res.insert(res.end(), buffer, buffer + out_len);
        i += conv.length;
    }

    return res;
}